

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utext.cpp
# Opt level: O2

int64_t ucstrTextLength(UText *ut)

{
  long lVar1;
  
  if (-1 < ut->a) {
    return ut->a;
  }
  lVar1 = ut->chunkNativeLimit;
  while (*(short *)((long)ut->context + lVar1 * 2) != 0) {
    lVar1 = lVar1 + 1;
    ut->chunkNativeLimit = lVar1;
  }
  ut->a = lVar1;
  ut->chunkLength = (int32_t)lVar1;
  ut->nativeIndexingLimit = (int32_t)lVar1;
  *(byte *)&ut->providerProperties = (byte)ut->providerProperties & 0xfd;
  return lVar1;
}

Assistant:

static int64_t U_CALLCONV
ucstrTextLength(UText *ut) {
    if (ut->a < 0) {
        // null terminated, we don't yet know the length.  Scan for it.
        //    Access is not convenient for doing this
        //    because the current interation postion can't be changed.
        const UChar  *str = (const UChar *)ut->context;
        for (;;) {
            if (str[ut->chunkNativeLimit] == 0) {
                break;
            }
            ut->chunkNativeLimit++;
        }
        ut->a = ut->chunkNativeLimit;
        ut->chunkLength = (int32_t)ut->chunkNativeLimit;
        ut->nativeIndexingLimit = ut->chunkLength;
        ut->providerProperties &= ~I32_FLAG(UTEXT_PROVIDER_LENGTH_IS_EXPENSIVE);
    }
    return ut->a;
}